

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O2

void xercesc_4_0::XTemplateSerializer::storeObject
               (NameIdPool<xercesc_4_0::XMLNotationDecl> *objToStore,XSerializeEngine *serEng)

{
  bool bVar1;
  XMLNotationDecl *pXVar2;
  ulong uVar3;
  NameIdPoolEnumerator<xercesc_4_0::XMLNotationDecl> e;
  NameIdPoolEnumerator<xercesc_4_0::XMLNotationDecl> local_38;
  
  bVar1 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  if (bVar1) {
    local_38.fMemoryManager = objToStore->fMemoryManager;
    local_38.super_XMLEnumerator<xercesc_4_0::XMLNotationDecl>._vptr_XMLEnumerator =
         (_func_int **)&PTR__XMLEnumerator_004003e8;
    uVar3 = (ulong)(objToStore->fIdCounter != 0);
    local_38.fCurIndex = uVar3;
    local_38.fToEnum = objToStore;
    XSerializeEngine::operator<<(serEng,(uint)objToStore->fIdCounter);
    while ((uVar3 != 0 && (uVar3 <= (local_38.fToEnum)->fIdCounter))) {
      pXVar2 = NameIdPoolEnumerator<xercesc_4_0::XMLNotationDecl>::nextElement(&local_38);
      (*(pXVar2->super_XSerializable)._vptr_XSerializable[3])(pXVar2,serEng);
      uVar3 = local_38.fCurIndex;
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(NameIdPool<XMLNotationDecl>* const objToStore
                                    , XSerializeEngine&                  serEng)
{
    if (serEng.needToStoreObject(objToStore))
    {
        NameIdPoolEnumerator<XMLNotationDecl> e(objToStore, objToStore->getMemoryManager());

        serEng<<(unsigned int)e.size();

        while (e.hasMoreElements())
        {
            XMLNotationDecl& data = e.nextElement();
            data.serialize(serEng);
        }
    }
}